

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_decoder_factory.h
# Opt level: O1

unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_>_>
 __thiscall
draco::
CreatePredictionSchemeForDecoder<int,draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>>
          (draco *this,PredictionSchemeMethod method,int att_id,PointCloudDecoder *decoder,
          PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int> *transform)

{
  ushort uVar1;
  __uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> _Var2;
  undefined8 uVar3;
  int iVar4;
  undefined8 *puVar5;
  pointer *__ptr;
  MeshDecoder *mesh_decoder;
  
  if (method == PREDICTION_NONE) {
    *(undefined8 *)this = 0;
    puVar5 = (undefined8 *)0x0;
  }
  else {
    _Var2._M_t.
    super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
    super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
         (decoder->point_cloud_->attributes_).
         super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[att_id]._M_t.
         super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>.
         _M_t;
    iVar4 = (*decoder->_vptr_PointCloudDecoder[2])(decoder);
    if (iVar4 == 1) {
      uVar1._0_1_ = decoder->version_major_;
      uVar1._1_1_ = decoder->version_minor_;
      CreateMeshPredictionScheme<draco::MeshDecoder,draco::PredictionSchemeDecoder<int,draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>>,draco::MeshPredictionSchemeDecoderFactory<int>>
                (this,(MeshDecoder *)decoder,method,att_id,transform,uVar1 << 8 | uVar1 >> 8);
      if (*(long *)this != 0) {
        return (__uniq_ptr_data<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_>,_true,_true>
                )(__uniq_ptr_data<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_>,_true,_true>
                  )this;
      }
      *(undefined8 *)this = 0;
    }
    puVar5 = (undefined8 *)operator_new(0x28);
    *puVar5 = &PTR__PredictionSchemeInterface_001e13f8;
    ((tuple<draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_> *)(puVar5 + 1))->
    super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_> =
         (_Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>)
         _Var2._M_t.
         super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
         .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl;
    uVar3 = *(undefined8 *)
             &(transform->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
              super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.
              max_value_;
    puVar5[2] = *(undefined8 *)
                 &(transform->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>)
                  .super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_;
    puVar5[3] = uVar3;
    *(int32_t *)(puVar5 + 4) =
         (transform->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
         super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.center_value_
    ;
    *puVar5 = &PTR__PredictionSchemeInterface_001e16a8;
  }
  *(undefined8 **)this = puVar5;
  return (__uniq_ptr_data<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_>,_true,_true>
          )(__uniq_ptr_data<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<PredictionSchemeDecoder<DataTypeT, TransformT>>
CreatePredictionSchemeForDecoder(PredictionSchemeMethod method, int att_id,
                                 const PointCloudDecoder *decoder,
                                 const TransformT &transform) {
  if (method == PREDICTION_NONE) {
    return nullptr;
  }
  const PointAttribute *const att = decoder->point_cloud()->attribute(att_id);
  if (decoder->GetGeometryType() == TRIANGULAR_MESH) {
    // Cast the decoder to mesh decoder. This is not necessarily safe if there
    // is some other decoder decides to use TRIANGULAR_MESH as the return type,
    // but unfortunately there is not nice work around for this without using
    // RTTI (double dispatch and similar concepts will not work because of the
    // template nature of the prediction schemes).
    const MeshDecoder *const mesh_decoder =
        static_cast<const MeshDecoder *>(decoder);

    auto ret = CreateMeshPredictionScheme<
        MeshDecoder, PredictionSchemeDecoder<DataTypeT, TransformT>,
        MeshPredictionSchemeDecoderFactory<DataTypeT>>(
        mesh_decoder, method, att_id, transform, decoder->bitstream_version());
    if (ret) {
      return ret;
    }
    // Otherwise try to create another prediction scheme.
  }
  // Create delta decoder.
  return std::unique_ptr<PredictionSchemeDecoder<DataTypeT, TransformT>>(
      new PredictionSchemeDeltaDecoder<DataTypeT, TransformT>(att, transform));
}